

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCnf.c
# Opt level: O1

void Sfm_TranslateCnf(Vec_Wec_t *vRes,Vec_Str_t *vCnf,Vec_Int_t *vFaninMap,int iPivotVar)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  
  iVar1 = vRes->nSize;
  if (0 < (long)iVar1) {
    pVVar3 = vRes->pArray;
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&pVVar3->nSize + lVar5) = 0;
      lVar5 = lVar5 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar5);
  }
  vRes->nSize = 0;
  pVVar3 = Vec_WecPushLevel(vRes);
  if (0 < vCnf->nSize) {
    lVar5 = 0;
    do {
      uVar6 = (uint)vCnf->pArray[lVar5];
      if (uVar6 == 0xffffffff) {
        pVVar3 = Vec_WecPushLevel(vRes);
      }
      else {
        if (vCnf->pArray[lVar5] < '\0') {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x134,"int Abc_Lit2LitV(int *, int)");
        }
        iVar1 = vFaninMap->pArray[uVar6 >> 1];
        if (iVar1 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar2 = pVVar3->nCap;
        if (pVVar3->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar3->pArray == (int *)0x0) {
              piVar4 = (int *)malloc(0x40);
            }
            else {
              piVar4 = (int *)realloc(pVVar3->pArray,0x40);
            }
            pVVar3->pArray = piVar4;
            iVar7 = 0x10;
          }
          else {
            iVar7 = uVar2 * 2;
            if (iVar7 <= (int)uVar2) goto LAB_008d30e2;
            if (pVVar3->pArray == (int *)0x0) {
              piVar4 = (int *)malloc((ulong)uVar2 << 3);
            }
            else {
              piVar4 = (int *)realloc(pVVar3->pArray,(ulong)uVar2 << 3);
            }
            pVVar3->pArray = piVar4;
          }
          if (piVar4 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar3->nCap = iVar7;
        }
LAB_008d30e2:
        iVar7 = pVVar3->nSize;
        pVVar3->nSize = iVar7 + 1;
        pVVar3->pArray[iVar7] = (uint)(iVar1 == iPivotVar) ^ (uVar6 & 1) + iVar1 * 2;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vCnf->nSize);
  }
  return;
}

Assistant:

void Sfm_TranslateCnf( Vec_Wec_t * vRes, Vec_Str_t * vCnf, Vec_Int_t * vFaninMap, int iPivotVar )
{
    Vec_Int_t * vClause;
    signed char Entry;
    int i, Lit;
    Vec_WecClear( vRes );
    vClause = Vec_WecPushLevel( vRes );
    Vec_StrForEachEntry( vCnf, Entry, i )
    {
        if ( (int)Entry == -1 )
        {
            vClause = Vec_WecPushLevel( vRes );
            continue;
        }
        Lit = Abc_Lit2LitV( Vec_IntArray(vFaninMap), (int)Entry );
        Lit = Abc_LitNotCond( Lit, Abc_Lit2Var(Lit) == iPivotVar );
        Vec_IntPush( vClause, Lit );
    }
}